

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign<unsigned_char>
          (CImgDisplay *this,CImg<unsigned_char> *img,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  byte *pbVar1;
  CImgDisplay *pCVar2;
  CImg<unsigned_char> tmp;
  CImg<unsigned_char> local_78;
  CImg<unsigned_char> local_58;
  
  if (img->_data != (uchar *)0x0) {
    local_58._data = (uchar *)0x0;
    local_58._width = 0;
    local_58._height = 0;
    local_58._depth = 0;
    local_58._spectrum = 0;
    local_58._is_shared = false;
    if (img->_depth != 1) {
      CImg<unsigned_char>::get_projections2d
                (&local_78,img,img->_width >> 1,img->_height >> 1,img->_depth >> 1);
      img = CImg<unsigned_char>::assign
                      (&local_58,local_78._data,local_78._width,local_78._height,local_78._depth,
                       local_78._spectrum);
      if ((local_78._is_shared == false) && (local_78._data != (uchar *)0x0)) {
        operator_delete__(local_78._data);
      }
    }
    _assign(this,img->_width,img->_height,title,normalization_type,fullscreen_flag,closed_flag);
    if (this->_normalization == 2) {
      pbVar1 = CImg<unsigned_char>::min_max<float>(img,&this->_max);
      this->_min = (float)*pbVar1;
    }
    pCVar2 = render<unsigned_char>(this,img,false);
    pCVar2 = paint(pCVar2,true);
    if ((local_58._is_shared == false) && (local_58._data != (uchar *)0x0)) {
      operator_delete__(local_58._data);
    }
    return pCVar2;
  }
  pCVar2 = assign(this);
  return pCVar2;
}

Assistant:

CImgDisplay& assign(const CImg<T>& img, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!img) return assign();
      CImg<T> tmp;
      const CImg<T>& nimg = (img._depth==1)?img:(tmp=img.get_projections2d(img._width/2,img._height/2,img._depth/2));
      _assign(nimg._width,nimg._height,title,normalization_type,fullscreen_flag,closed_flag);
      if (_normalization==2) _min = (float)nimg.min_max(_max);
      return render(nimg).paint();
    }